

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Node * prvTidyTextToken(Lexer *lexer)

{
  Node *pNVar1;
  Node *node;
  Lexer *lexer_local;
  
  pNVar1 = prvTidyNewNode(lexer->allocator,lexer);
  pNVar1->start = lexer->txtstart;
  pNVar1->end = lexer->txtend;
  return pNVar1;
}

Assistant:

Node* TY_(TextToken)( Lexer *lexer )
{
    Node *node = TY_(NewNode)( lexer->allocator, lexer );
    node->start = lexer->txtstart;
    node->end = lexer->txtend;
    return node;
}